

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

Vec_Int_t * Ga2_ManCnfCompute(uint uTruth,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int RetValue;
  Vec_Int_t *vCover_local;
  int nVars_local;
  uint uTruth_local;
  
  vCover_local._0_4_ = nVars;
  vCover_local._4_4_ = uTruth;
  if (5 < nVars) {
    __assert_fail("nVars <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x279,"Vec_Int_t *Ga2_ManCnfCompute(unsigned int, int, Vec_Int_t *)");
  }
  iVar1 = Kit_TruthIsop((uint *)((long)&vCover_local + 4),nVars,vCover,0);
  if (iVar1 == 0) {
    pVVar2 = Vec_IntDup(vCover);
    return pVVar2;
  }
  __assert_fail("RetValue == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                ,0x27c,"Vec_Int_t *Ga2_ManCnfCompute(unsigned int, int, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Ga2_ManCnfCompute( unsigned uTruth, int nVars, Vec_Int_t * vCover )
{
    int RetValue;
    assert( nVars <= 5 );
    // transform truth table into the SOP
    RetValue = Kit_TruthIsop( &uTruth, nVars, vCover, 0 );
    assert( RetValue == 0 );
    // check the case of constant cover
    return Vec_IntDup( vCover );
}